

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpint.c
# Opt level: O1

mp_int * mp_modsqrt(ModsqrtContext *sc,mp_int *x,uint *success)

{
  MontyContext *mc;
  mp_int *pmVar1;
  mp_int *x_00;
  
  pmVar1 = mp_modmul(x,sc->mc->powers_of_r_mod_m[0],sc->mc->m);
  x_00 = monty_modsqrt(sc,pmVar1,success);
  mp_free(pmVar1);
  mc = sc->mc;
  pmVar1 = mp_make_sized(mc->rw);
  monty_export_into(mc,pmVar1,x_00);
  mp_free(x_00);
  return pmVar1;
}

Assistant:

mp_int *mp_modsqrt(ModsqrtContext *sc, mp_int *x, unsigned *success)
{
    mp_int *mx = monty_import(sc->mc, x);
    mp_int *mroot = monty_modsqrt(sc, mx, success);
    mp_free(mx);
    mp_int *root = monty_export(sc->mc, mroot);
    mp_free(mroot);
    return root;
}